

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O3

void __thiscall
flatbuffers::jsons::JsonSchemaGenerator::JsonSchemaGenerator
          (JsonSchemaGenerator *this,Parser *parser,string *path,string *file_name)

{
  char *__end;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"json","");
  BaseGenerator::BaseGenerator
            (&this->super_BaseGenerator,parser,path,file_name,&local_70,&local_90,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  (this->super_BaseGenerator)._vptr_BaseGenerator = (_func_int **)&PTR_generate_003ea608;
  (this->code_)._M_dataplus._M_p = (pointer)&(this->code_).field_2;
  (this->code_)._M_string_length = 0;
  (this->code_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

JsonSchemaGenerator(const Parser &parser, const std::string &path,
                      const std::string &file_name)
      : BaseGenerator(parser, path, file_name, "", "", "json") {}